

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextSpan.cpp
# Opt level: O0

ostream * psy::operator<<(ostream *os,TextSpan *span)

{
  uint uVar1;
  ostream *poVar2;
  TextSpan *span_local;
  ostream *os_local;
  
  uVar1 = TextSpan::start(span);
  poVar2 = (ostream *)std::ostream::operator<<(os,uVar1);
  poVar2 = std::operator<<(poVar2,"..");
  uVar1 = TextSpan::end(span);
  std::ostream::operator<<(poVar2,uVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const TextSpan& span)
{
    os << span.start() << ".." << span.end();
    return os;
}